

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int make_toc(archive_write *a)

{
  char *pcVar1;
  xar_conflict *a_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  time_t t;
  char *value;
  size_t size_00;
  size_t size;
  int ret;
  int r;
  int algsize;
  size_t use;
  char *content;
  xml_writer *writer;
  file_conflict *np;
  xar_conflict *xar;
  archive_write *a_local;
  
  np = (file_conflict *)a->format_data;
  size._4_4_ = -0x1e;
  content = (char *)0x0;
  xar = (xar_conflict *)a;
  uVar2 = xml_writer_create((xml_writer **)&content);
  if ((int)uVar2 < 0) {
    archive_set_error((archive *)xar,-1,"xml_writer_create() failed: %d",(ulong)uVar2);
  }
  else {
    uVar2 = xml_writer_set_indent((xml_writer *)content,4);
    if ((int)uVar2 < 0) {
      archive_set_error((archive *)xar,-1,"xml_writer_set_indent() failed: %d",(ulong)uVar2);
    }
    else {
      uVar2 = xml_writer_start_document((xml_writer *)content);
      if ((int)uVar2 < 0) {
        archive_set_error((archive *)xar,-1,"xml_writer_start_document() failed: %d",(ulong)uVar2);
      }
      else {
        uVar2 = xml_writer_start_element((xml_writer *)content,"xar");
        if ((int)uVar2 < 0) {
          archive_set_error((archive *)xar,-1,"xml_writer_start_element() failed: %d",(ulong)uVar2);
        }
        else {
          uVar2 = xml_writer_start_element((xml_writer *)content,"toc");
          a_00 = xar;
          pcVar1 = content;
          if ((int)uVar2 < 0) {
            archive_set_error((archive *)xar,-1,"xml_writer_start_element() failed: %d",(ulong)uVar2
                             );
          }
          else {
            t = time((time_t *)0x0);
            iVar3 = xmlwrite_time((archive_write *)a_00,(xml_writer *)pcVar1,"creation-time",t,0);
            if (-1 < iVar3) {
              uVar2 = getalgsize((sumalg)(np->parentdir).buffer_length);
              if (uVar2 != 0) {
                uVar4 = xml_writer_start_element((xml_writer *)content,"checksum");
                pcVar1 = content;
                if ((int)uVar4 < 0) {
                  archive_set_error((archive *)xar,-1,"xml_writer_start_element() failed: %d",
                                    (ulong)uVar4);
                  goto LAB_0030b82e;
                }
                value = getalgname((sumalg)(np->parentdir).buffer_length);
                uVar4 = xml_writer_write_attribute((xml_writer *)pcVar1,"style",value);
                if ((int)uVar4 < 0) {
                  archive_set_error((archive *)xar,-1,"xml_writer_write_attribute() failed: %d",
                                    (ulong)uVar4);
                  goto LAB_0030b82e;
                }
                iVar3 = xmlwrite_string((archive_write *)xar,(xml_writer *)content,"offset","0");
                if ((iVar3 < 0) ||
                   (iVar3 = xmlwrite_fstring((archive_write *)xar,(xml_writer *)content,"size","%d",
                                             (ulong)uVar2), iVar3 < 0)) goto LAB_0030b82e;
                uVar2 = xml_writer_end_element((xml_writer *)content);
                if ((int)uVar2 < 0) {
                  archive_set_error((archive *)xar,-1,"xml_writer_end_element() failed: %d",
                                    (ulong)uVar2);
                  goto LAB_0030b82e;
                }
              }
              writer = *(xml_writer **)&np->id;
              do {
                if ((writer != *(xml_writer **)&writer[3].indent) &&
                   (iVar3 = make_file_entry((archive_write *)xar,(xml_writer *)content,
                                            (file_conflict *)writer), iVar3 != 0))
                goto LAB_0030b82e;
                if (((*(byte *)&writer[0xf].writer >> 1 & 1) == 0) ||
                   (writer[4].writer == (xmlTextWriterPtr)0x0)) {
                  for (; writer != *(xml_writer **)&writer[3].indent;
                      writer = *(xml_writer **)&writer[3].indent) {
                    uVar2 = xml_writer_end_element((xml_writer *)content);
                    if ((int)uVar2 < 0) {
                      archive_set_error((archive *)xar,-1,"xml_writer_end_element() failed: %d",
                                        (ulong)uVar2);
                      goto LAB_0030b82e;
                    }
                    if (*(long *)&writer[2].indent != 0) {
                      writer = *(xml_writer **)&writer[2].indent;
                      uVar2 = xml_writer_start_element((xml_writer *)content,"file");
                      if ((int)uVar2 < 0) {
                        archive_set_error((archive *)xar,-1,"xml_writer_start_element() failed: %d",
                                          (ulong)uVar2);
                        goto LAB_0030b82e;
                      }
                      uVar2 = xml_writer_write_attributef
                                        ((xml_writer *)content,"id","%d",
                                         (ulong)*(uint *)&writer[1].writer);
                      if ((int)uVar2 < 0) {
                        archive_set_error((archive *)xar,-1,
                                          "xml_writer_write_attributef() failed: %d",(ulong)uVar2);
                        goto LAB_0030b82e;
                      }
                      break;
                    }
                  }
                }
                else {
                  writer = (xml_writer *)writer[4].writer;
                  uVar2 = xml_writer_start_element((xml_writer *)content,"file");
                  if ((int)uVar2 < 0) {
                    archive_set_error((archive *)xar,-1,"xml_writer_start_element() failed: %d",
                                      (ulong)uVar2);
                    goto LAB_0030b82e;
                  }
                  uVar2 = xml_writer_write_attributef
                                    ((xml_writer *)content,"id","%d",
                                     (ulong)*(uint *)&writer[1].writer);
                  if ((int)uVar2 < 0) {
                    archive_set_error((archive *)xar,-1,"xml_writer_write_attributef() failed: %d",
                                      (ulong)uVar2);
                    goto LAB_0030b82e;
                  }
                }
              } while (writer != *(xml_writer **)&writer[3].indent);
              uVar2 = xml_writer_end_document((xml_writer *)content);
              if ((int)uVar2 < 0) {
                archive_set_error((archive *)xar,-1,"xml_writer_end_document() failed: %d",
                                  (ulong)uVar2);
              }
              else {
                uVar2 = xml_writer_get_final_content_and_length
                                  ((xml_writer *)content,(char **)&use,(size_t *)&r);
                if ((int)uVar2 < 0) {
                  archive_set_error((archive *)xar,-1,
                                    "xml_writer_get_final_content_and_length() failed: %d",
                                    (ulong)uVar2);
                }
                else {
                  np[0xb2].script.length = (size_t)(np->rbnode).rb_nodes[1];
                  *(size_t *)&np[0xb2].field_0x168 = _r;
                  checksum_init((chksumwork_conflict *)&(np->basename).buffer_length,
                                (sumalg)(np->parentdir).buffer_length);
                  iVar3 = compression_init_encoder_gzip
                                    ((archive *)xar,(la_zstream_conflict *)&(np->xattr).last,6,1);
                  if (iVar3 == 0) {
                    (np->xattr).last = (heap_data **)use;
                    *(size_t *)&np->data = _r;
                    (np->data).next = (heap_data *)0x0;
                    (np->data).temp_offset = (uint64_t)((np->data).a_sum.val + 0x10);
                    (np->data).length = 0x10000;
                    (np->data).size = 0;
                    while( true ) {
                      iVar3 = compression_code((archive *)xar,
                                               (la_zstream_conflict *)&(np->xattr).last,
                                               ARCHIVE_Z_FINISH);
                      if ((iVar3 != 0) && (iVar3 != 1)) goto LAB_0030b82e;
                      size_00 = 0x10000 - (np->data).length;
                      checksum_update((chksumwork_conflict *)&(np->basename).buffer_length,
                                      (np->data).a_sum.val + 0x10,size_00);
                      iVar5 = write_to_temp((archive_write *)xar,(np->data).a_sum.val + 0x10,size_00
                                           );
                      if (iVar5 != 0) goto LAB_0030b82e;
                      if (iVar3 == 1) break;
                      (np->data).temp_offset = (uint64_t)((np->data).a_sum.val + 0x10);
                      (np->data).length = 0x10000;
                    }
                    iVar3 = compression_end((archive *)xar,(la_zstream_conflict *)&(np->xattr).last)
                    ;
                    if (iVar3 == 0) {
                      np[0xb2].script.buffer_length = (np->data).size;
                      *(undefined4 *)np[0xb3].rbnode.rb_nodes = 1;
                      checksum_final((chksumwork_conflict *)&(np->basename).buffer_length,
                                     (chksumval_conflict *)(np[0xb3].rbnode.rb_nodes + 1));
                      size._4_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0030b82e:
  if (content != (char *)0x0) {
    xml_writer_destroy((xml_writer *)content);
  }
  return size._4_4_;
}

Assistant:

static int
make_toc(struct archive_write *a)
{
	struct xar *xar;
	struct file *np;
	struct xml_writer *writer;
	const char* content;
	size_t use;
	int algsize;
	int r, ret;

	xar = (struct xar *)a->format_data;

	ret = ARCHIVE_FATAL;

	/*
	 * Initialize xml writer.
	 */
	writer = NULL;
	r = xml_writer_create(&writer);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_create() failed: %d", r);
		goto exit_toc;
	}
	r = xml_writer_set_indent(writer, 4);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_set_indent() failed: %d", r);
		goto exit_toc;
	}
	r = xml_writer_start_document(writer);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_start_document() failed: %d", r);
		goto exit_toc;
	}

	/*
	 * Start recording TOC
	 */
	r = xml_writer_start_element(writer, "xar");
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_start_element() failed: %d", r);
		goto exit_toc;
	}
	r = xml_writer_start_element(writer, "toc");
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_start_element() failed: %d", r);
		goto exit_toc;
	}

	/*
	 * Record the creation time of the archive file.
	 */
	r = xmlwrite_time(a, writer, "creation-time", time(NULL), 0);
	if (r < 0)
		goto exit_toc;

	/*
	 * Record the checksum value of TOC
	 */
	algsize = getalgsize(xar->opt_toc_sumalg);
	if (algsize) {
		/*
		 * Record TOC checksum
		 */
		r = xml_writer_start_element(writer, "checksum");
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_start_element() failed: %d", r);
			goto exit_toc;
		}
		r = xml_writer_write_attribute(writer, "style",
		    getalgname(xar->opt_toc_sumalg));
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_attribute() failed: %d", r);
			goto exit_toc;
		}

		/*
		 * Record the offset of the value of checksum of TOC
		 */
		r = xmlwrite_string(a, writer, "offset", "0");
		if (r < 0)
			goto exit_toc;

		/*
		 * Record the size of the value of checksum of TOC
		 */
		r = xmlwrite_fstring(a, writer, "size", "%d", algsize);
		if (r < 0)
			goto exit_toc;

		r = xml_writer_end_element(writer);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_end_element() failed: %d", r);
			goto exit_toc;
		}
	}

	np = xar->root;
	do {
		if (np != np->parent) {
			r = make_file_entry(a, writer, np);
			if (r != ARCHIVE_OK)
				goto exit_toc;
		}

		if (np->dir && np->children.first != NULL) {
			/* Enter to sub directories. */
			np = np->children.first;
			r = xml_writer_start_element(writer,
			    "file");
			if (r < 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xml_writer_start_element() "
				    "failed: %d", r);
				goto exit_toc;
			}
			r = xml_writer_write_attributef(
			    writer, "id", "%d", np->id);
			if (r < 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xml_writer_write_attributef() "
				    "failed: %d", r);
				goto exit_toc;
			}
			continue;
		}
		while (np != np->parent) {
			r = xml_writer_end_element(writer);
			if (r < 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "xml_writer_end_element() "
				    "failed: %d", r);
				goto exit_toc;
			}
			if (np->chnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
			} else {
				np = np->chnext;
				r = xml_writer_start_element(writer,
				    "file");
				if (r < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "xml_writer_start_element() "
					    "failed: %d", r);
					goto exit_toc;
				}
				r = xml_writer_write_attributef(
				    writer, "id", "%d", np->id);
				if (r < 0) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "xml_writer_write_attributef() "
					    "failed: %d", r);
					goto exit_toc;
				}
				break;
			}
		}
	} while (np != np->parent);

	r = xml_writer_end_document(writer);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_end_document() failed: %d", r);
		goto exit_toc;
	}

	r = xml_writer_get_final_content_and_length(writer, &content, &use);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_get_final_content_and_length() failed: %d", r);
		goto exit_toc;
	}

#if DEBUG_PRINT_TOC
	fprintf(stderr, "\n---TOC-- %d bytes --\n%s\n",
	    (int)strlen(content), content);
#endif

	/*
	 * Compress the TOC and calculate the sum of the TOC.
	 */
	xar->toc.temp_offset = xar->temp_offset;
	xar->toc.size = (uint64_t)use;
	checksum_init(&(xar->a_sumwrk), xar->opt_toc_sumalg);

	r = compression_init_encoder_gzip(&(a->archive),
	    &(xar->stream), 6, 1);
	if (r != ARCHIVE_OK)
		goto exit_toc;
	xar->stream.next_in = (const unsigned char *)content;
	xar->stream.avail_in = use;
	xar->stream.total_in = 0;
	xar->stream.next_out = xar->wbuff;
	xar->stream.avail_out = sizeof(xar->wbuff);
	xar->stream.total_out = 0;
	for (;;) {
		size_t size;

		r = compression_code(&(a->archive),
		    &(xar->stream), ARCHIVE_Z_FINISH);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			goto exit_toc;
		size = sizeof(xar->wbuff) - xar->stream.avail_out;
		checksum_update(&(xar->a_sumwrk), xar->wbuff, size);
		if (write_to_temp(a, xar->wbuff, size) != ARCHIVE_OK)
			goto exit_toc;
		if (r == ARCHIVE_EOF)
			break;
		xar->stream.next_out = xar->wbuff;
		xar->stream.avail_out = sizeof(xar->wbuff);
	}
	r = compression_end(&(a->archive), &(xar->stream));
	if (r != ARCHIVE_OK)
		goto exit_toc;
	xar->toc.length = xar->stream.total_out;
	xar->toc.compression = GZIP;
	checksum_final(&(xar->a_sumwrk), &(xar->toc.a_sum));

	ret = ARCHIVE_OK;
exit_toc:
	if (writer)
		xml_writer_destroy(writer);

	return (ret);
}